

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_req_set_reader(Curl_easy *data,Curl_HttpReq httpreq,char **tep)

{
  _Bool _Var1;
  char *headerline;
  curl_off_t cVar2;
  curl_off_t req_clen;
  char *ptr;
  CURLcode result;
  char **tep_local;
  Curl_HttpReq httpreq_local;
  Curl_easy *data_local;
  
  data_local._4_4_ = set_reader(data,httpreq);
  if ((data_local._4_4_ == CURLE_OK) &&
     (data_local._4_4_ = http_resume(data,httpreq), data_local._4_4_ == CURLE_OK)) {
    headerline = Curl_checkheaders(data,"Transfer-Encoding",0x11);
    if (headerline == (char *)0x0) {
      cVar2 = Curl_creader_total_length(data);
      if (cVar2 < 0) {
        _Var1 = Curl_use_http_1_1plus(data,data->conn);
        if (!_Var1) {
          Curl_failf(data,"Chunky upload is not supported by HTTP 1.0");
          return CURLE_UPLOAD_FAILED;
        }
        *(uint *)&(data->req).field_0xd9 =
             *(uint *)&(data->req).field_0xd9 & 0xffff7fff |
             (uint)(data->conn->httpversion < 0x14) << 0xf;
      }
      else {
        *(uint *)&(data->req).field_0xd9 = *(uint *)&(data->req).field_0xd9 & 0xffff7fff;
      }
      if ((*(uint *)&(data->req).field_0xd9 >> 0xf & 1) != 0) {
        *tep = "Transfer-Encoding: chunked\r\n";
      }
    }
    else {
      _Var1 = Curl_compareheader(headerline,"Transfer-Encoding:",0x12,"chunked",7);
      *(uint *)&(data->req).field_0xd9 =
           *(uint *)&(data->req).field_0xd9 & 0xffff7fff | (uint)_Var1 << 0xf;
      if ((((*(uint *)&(data->req).field_0xd9 >> 0xf & 1) != 0) &&
          (_Var1 = Curl_use_http_1_1plus(data,data->conn), _Var1)) &&
         (0x13 < data->conn->httpversion)) {
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
           && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
          Curl_infof(data,
                     "suppressing chunked transfer encoding on connection using HTTP version 2 or higher"
                    );
        }
        *(uint *)&(data->req).field_0xd9 = *(uint *)&(data->req).field_0xd9 & 0xffff7fff;
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_http_req_set_reader(struct Curl_easy *data,
                                  Curl_HttpReq httpreq,
                                  const char **tep)
{
  CURLcode result = CURLE_OK;
  const char *ptr;

  result = set_reader(data, httpreq);
  if(result)
    return result;

  result = http_resume(data, httpreq);
  if(result)
    return result;

  ptr = Curl_checkheaders(data, STRCONST("Transfer-Encoding"));
  if(ptr) {
    /* Some kind of TE is requested, check if 'chunked' is chosen */
    data->req.upload_chunky =
      Curl_compareheader(ptr,
                         STRCONST("Transfer-Encoding:"), STRCONST("chunked"));
    if(data->req.upload_chunky &&
       Curl_use_http_1_1plus(data, data->conn) &&
       (data->conn->httpversion >= 20)) {
       infof(data, "suppressing chunked transfer encoding on connection "
             "using HTTP version 2 or higher");
       data->req.upload_chunky = FALSE;
    }
  }
  else {
    curl_off_t req_clen = Curl_creader_total_length(data);

    if(req_clen < 0) {
      /* indeterminate request content length */
      if(Curl_use_http_1_1plus(data, data->conn)) {
        /* On HTTP/1.1, enable chunked, on HTTP/2 and later we do not
         * need it */
        data->req.upload_chunky = (data->conn->httpversion < 20);
      }
      else {
        failf(data, "Chunky upload is not supported by HTTP 1.0");
        return CURLE_UPLOAD_FAILED;
      }
    }
    else {
      /* else, no chunky upload */
      data->req.upload_chunky = FALSE;
    }

    if(data->req.upload_chunky)
      *tep = "Transfer-Encoding: chunked\r\n";
  }
  return result;
}